

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.cpp
# Opt level: O0

void Timidity::pre_resample(Renderer *song,Sample *sp)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  double dVar11;
  float local_88;
  int m;
  int o;
  sample_t *vptr;
  sample_t v4;
  sample_t v3;
  sample_t v2;
  sample_t v1;
  sample_t *src;
  sample_t *dest;
  sample_t *newdata;
  int count;
  int newlen;
  int ofs;
  int incr;
  double xdiff;
  double a;
  Sample *sp_local;
  Renderer *song_local;
  
  pfVar3 = sp->data;
  if (sp->scale_factor == 0) {
    cmsg(0,2," * pre-resampling for note %d (%s%d)\n",(ulong)(uint)(int)sp->scale_note,
         pre_resample::note_name + (int)sp->scale_note % 0xc,
         (ulong)((int)sp->scale_note & 0x7f) / 0xc);
    iVar5 = sp->sample_rate;
    dVar11 = pow(2.0,(double)(int)sp->scale_note / 12.0);
    fVar10 = ((float)iVar5 * (float)(dVar11 * 8175.798947309669)) / (sp->root_freq * song->rate);
    if (((0.0 < fVar10) && (iVar5 = (int)((float)sp->data_length / fVar10), -1 < iVar5)) &&
       (iVar6 = iVar5 >> 0xc, iVar6 < 0x100001)) {
      pfVar8 = (float *)safe_malloc((long)iVar6 << 2);
      iVar7 = (sp->data_length + -0x1000) / iVar6;
      newdata._0_4_ = iVar6 + -1;
      src = pfVar8;
      count = iVar7;
      if ((int)newdata != 0) {
        src = pfVar8 + 1;
        *pfVar8 = *pfVar3;
      }
      while( true ) {
        newdata._0_4_ = (int)newdata + -1;
        iVar6 = count >> 0xc;
        if ((int)newdata == 0) break;
        pfVar9 = pfVar3 + iVar6;
        if (pfVar9 == pfVar3) {
          local_88 = *pfVar9;
        }
        else {
          local_88 = pfVar9[-1];
        }
        fVar1 = *pfVar9;
        fVar2 = pfVar9[1];
        fVar4 = (float)(count & 0xfff) * 0.00024414062;
        *src = fVar1 + (fVar4 / 6.0) *
                       ((((local_88 * -2.0 - fVar1 * 3.0) + fVar2 * 6.0) - pfVar9[2]) +
                       fVar4 * (((local_88 - fVar1 * 2.0) + fVar2) * 3.0 +
                               fVar4 * (-local_88 + (fVar1 - fVar2) * 3.0 + pfVar9[2])));
        src = src + 1;
        count = iVar7 + count;
      }
      if ((count & 0xfffU) == 0) {
        *src = pfVar3[iVar6];
      }
      else {
        *src = pfVar3[iVar6] +
               ((pfVar3[iVar6 + 1] - pfVar3[iVar6]) * (float)(count & 0xfff)) / 4096.0;
      }
      sp->data_length = iVar5;
      sp->loop_start = (int)((float)sp->loop_start / fVar10);
      sp->loop_end = (int)((float)sp->loop_end / fVar10);
      free(sp->data);
      sp->data = pfVar8;
      sp->sample_rate = 0;
    }
  }
  return;
}

Assistant:

void pre_resample(Renderer *song, Sample *sp)
{
	double a, xdiff;
	int incr, ofs, newlen, count;
	sample_t *newdata, *dest, *src = sp->data;
	sample_t v1, v2, v3, v4, *vptr;
	static const char note_name[12][3] =
	{
		"C", "C#", "D", "D#", "E", "F", "F#", "G", "G#", "A", "A#", "B"
	};

	if (sp->scale_factor != 0)
		return;

	cmsg(CMSG_INFO, VERB_NOISY, " * pre-resampling for note %d (%s%d)\n",
		sp->scale_note,
		note_name[sp->scale_note % 12], (sp->scale_note & 0x7F) / 12);

	a = (sp->sample_rate * note_to_freq(sp->scale_note)) / (sp->root_freq * song->rate);
	if (a <= 0)
		return;
	newlen = (int)(sp->data_length / a);
	if (newlen < 0 || (newlen >> FRACTION_BITS) > MAX_SAMPLE_SIZE)
		return;

	count = newlen >> FRACTION_BITS;
	dest = newdata = (sample_t *)safe_malloc(count * sizeof(float));

	ofs = incr = (sp->data_length - (1 << FRACTION_BITS)) / count;

	if (--count)
		*dest++ = src[0];

	/* Since we're pre-processing and this doesn't have to be done in
	real-time, we go ahead and do the full sliding cubic interpolation. */
	while (--count)
	{
		vptr = src + (ofs >> FRACTION_BITS);
		v1 = (vptr == src) ? *vptr : *(vptr - 1);
		v2 = *vptr;
		v3 = *(vptr + 1);
		v4 = *(vptr + 2);
		xdiff = FSCALENEG(ofs & FRACTION_MASK, FRACTION_BITS);
		*dest++ = sample_t(v2 + (xdiff / 6.0) * (-2 * v1 - 3 * v2 + 6 * v3 - v4 +
			xdiff * (3 * (v1 - 2 * v2 + v3) + xdiff * (-v1 + 3 * (v2 - v3) + v4))));
		ofs += incr;
	}

	if (ofs & FRACTION_MASK)
	{
		RESAMPLATION
	}
	else
	{
		*dest++ = src[ofs >> FRACTION_BITS];
	}

	sp->data_length = newlen;
	sp->loop_start = int(sp->loop_start / a);
	sp->loop_end = int(sp->loop_end / a);
	free(sp->data);
	sp->data = newdata;
	sp->sample_rate = 0;
}